

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

void Msat_OrderClean(Msat_Order_t *p,Msat_IntVec_t *vCone)

{
  int local_1c;
  int i;
  Msat_IntVec_t *vCone_local;
  Msat_Order_t *p_local;
  
  for (local_1c = 0; local_1c < p->vIndex->nSize; local_1c = local_1c + 1) {
    p->vIndex->pArray[local_1c] = 0;
  }
  local_1c = 0;
  while( true ) {
    if (vCone->nSize <= local_1c) {
      p->vHeap->nSize = vCone->nSize + 1;
      return;
    }
    if (p->vHeap->nCap <= local_1c + 1) break;
    p->vHeap->pArray[local_1c + 1] = vCone->pArray[local_1c];
    if (p->vIndex->nSize <= vCone->pArray[local_1c]) {
      __assert_fail("vCone->pArray[i] < p->vIndex->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatOrderH.c"
                    ,0x82,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
    }
    p->vIndex->pArray[vCone->pArray[local_1c]] = local_1c + 1;
    local_1c = local_1c + 1;
  }
  __assert_fail("i+1 < p->vHeap->nCap",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatOrderH.c"
                ,0x7f,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
}

Assistant:

void Msat_OrderClean( Msat_Order_t * p, Msat_IntVec_t * vCone )
{
    int i;
    for ( i = 0; i < p->vIndex->nSize; i++ )
        p->vIndex->pArray[i] = 0;
    for ( i = 0; i < vCone->nSize; i++ )
    {
        assert( i+1 < p->vHeap->nCap );
        p->vHeap->pArray[i+1] = vCone->pArray[i];

        assert( vCone->pArray[i] < p->vIndex->nSize );
        p->vIndex->pArray[vCone->pArray[i]] = i+1;
    }
    p->vHeap->nSize = vCone->nSize + 1;
}